

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kron.hpp
# Opt level: O1

void qclab::dense::kron<qclab::dense::SquareMatrix<std::complex<float>>>
               (SquareMatrix<std::complex<float>_> *A,SquareMatrix<std::complex<float>_> *B,
               SquareMatrix<std::complex<float>_> *kronAB)

{
  float fVar1;
  long lVar2;
  long lVar3;
  complex<float> *pcVar4;
  long lVar5;
  int64_t j;
  long lVar6;
  long lVar7;
  long lVar8;
  int64_t l;
  long lVar9;
  long lVar10;
  float fVar11;
  _ComplexT _Var12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  lVar2 = A->size_;
  lVar3 = B->size_;
  if (kronAB->size_ == lVar3 * lVar2) {
    if (0 < lVar2) {
      lVar7 = 0;
      do {
        if (0 < lVar3) {
          lVar10 = 0;
          do {
            lVar8 = 0;
            lVar6 = 0;
            do {
              lVar9 = 0;
              do {
                lVar5 = B->size_ * lVar9;
                pcVar4 = (B->data_)._M_t.
                         super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                         .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
                _Var12 = (A->data_)._M_t.
                         super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                         .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                         [A->size_ * lVar6 + lVar7]._M_value;
                fVar15 = *(float *)&pcVar4[lVar5 + lVar10]._M_value;
                fVar1 = *(float *)((long)&pcVar4[lVar5 + lVar10]._M_value + 4);
                fVar13 = (float)_Var12;
                fVar14 = (float)(_Var12 >> 0x20);
                fVar11 = fVar15 * fVar13 - fVar14 * fVar1;
                fVar15 = fVar15 * fVar14 + fVar13 * fVar1;
                _Var12 = CONCAT44(fVar15,fVar11);
                if ((NAN(fVar11)) && (_Var12 = CONCAT44(fVar15,fVar11), NAN(fVar15))) {
                  _Var12 = __mulsc3(fVar13);
                }
                (kronAB->data_)._M_t.
                super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                [(lVar8 + lVar9) * kronAB->size_ + lVar7 * lVar3 + lVar10]._M_value = _Var12;
                lVar9 = lVar9 + 1;
              } while (lVar3 != lVar9);
              lVar6 = lVar6 + 1;
              lVar8 = lVar8 + lVar3;
            } while (lVar6 != lVar2);
            lVar10 = lVar10 + 1;
          } while (lVar10 != lVar3);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != lVar2);
    }
    return;
  }
  __assert_fail("kronAB.rows() == rowsA * rowsB",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/kron.hpp"
                ,0x12,
                "void qclab::dense::kron(const T &, const T &, T &) [T = qclab::dense::SquareMatrix<std::complex<float>>]"
               );
}

Assistant:

void kron( const T& A , const T& B , T& kronAB ) {
      const int64_t rowsA = A.rows() ;
      const int64_t colsA = A.cols() ;
      const int64_t rowsB = B.rows() ;
      const int64_t colsB = B.cols() ;
      assert( kronAB.rows() == rowsA * rowsB ) ;
      assert( kronAB.cols() == colsA * colsB ) ;
      #pragma omp parallel for
      for ( int64_t i = 0; i < rowsA; i++ ) {        // i loops over rows of A
        for ( int64_t k = 0; k < rowsB; k++ ) {      // k loops over rows of B
          for ( int64_t j = 0; j < colsA; j++ ) {    // j loops over cols of A
            for ( int64_t l = 0; l < colsB; l++ ) {  // l loops over cols of B
              kronAB( i*rowsB + k , j*colsB + l ) = A(i,j) * B(k,l) ;
            }
          }
        }
      }
    }